

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_decompress4X2_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int flags)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  size_t sVar10;
  undefined2 *puVar11;
  byte bVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  undefined4 in_register_0000008c;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined2 *puVar24;
  void *pvVar25;
  undefined2 *puVar26;
  bool bVar27;
  BIT_DStream_t local_1b0;
  BIT_DStream_t local_188;
  BIT_DStream_t local_160;
  BIT_DStream_t local_138;
  undefined2 *local_110;
  undefined2 *local_108;
  undefined2 *local_100;
  HUF_DTable local_f4;
  undefined2 *local_f0;
  undefined2 *local_e8;
  int local_e0;
  uint local_dc;
  size_t *local_d8;
  undefined2 *local_d0;
  size_t local_c8;
  size_t *local_c0;
  size_t *local_b8;
  size_t *local_b0;
  size_t local_98;
  size_t local_88;
  size_t local_80;
  
  if ((flags & 1U) != 0) {
    if (((flags & 0x20U) == 0) &&
       (sVar10 = HUF_decompress4X2_usingDTable_internal_fast
                           (dst,dstSize,cSrc,cSrcSize,DTable,
                            (HUF_DecompressFastLoopFn)CONCAT44(in_register_0000008c,flags)),
       sVar10 != 0)) {
      return sVar10;
    }
    sVar10 = HUF_decompress4X2_usingDTable_internal_bmi2(dst,dstSize,cSrc,cSrcSize,DTable);
    return sVar10;
  }
  if (cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar18 = (ulong)*cSrc;
  uVar22 = (ulong)*(ushort *)((long)cSrc + 2);
  uVar21 = (ulong)*(ushort *)((long)cSrc + 4);
  uVar9 = uVar18 + uVar22 + uVar21 + 6;
  if (dstSize < 6) {
    return 0xffffffffffffffec;
  }
  if (cSrcSize < uVar9) {
    return 0xffffffffffffffec;
  }
  local_f0 = (undefined2 *)((long)dst + dstSize);
  uVar14 = dstSize + 3 >> 2;
  local_100 = (undefined2 *)((long)dst + uVar14);
  local_110 = (undefined2 *)((long)local_100 + uVar14);
  local_108 = (undefined2 *)(uVar14 + (long)local_110);
  if (local_f0 < local_108) {
    return 0xffffffffffffffec;
  }
  local_f4 = *DTable;
  local_e8 = (undefined2 *)dst;
  local_98 = dstSize;
  sVar10 = BIT_initDStream(&local_160,(void *)((long)cSrc + 6),uVar18);
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  pvVar25 = (void *)((long)cSrc + uVar18 + 6);
  sVar10 = BIT_initDStream(&local_188,pvVar25,uVar22);
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  pvVar25 = (void *)((long)pvVar25 + uVar22);
  sVar10 = BIT_initDStream(&local_1b0,pvVar25,uVar21);
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  sVar10 = BIT_initDStream(&local_138,(void *)((long)pvVar25 + uVar21),cSrcSize - uVar9);
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  puVar11 = (undefined2 *)((long)local_e8 + (local_98 - 7));
  cVar4 = (char)(local_f4 >> 0x10);
  puVar24 = local_108;
  local_d0 = local_100;
  puVar26 = local_110;
  if (7 < (ulong)((long)local_f0 - (long)local_108)) {
    local_80 = local_188.bitContainer;
    local_c8 = local_1b0.bitContainer;
    local_88 = local_138.bitContainer;
    bVar12 = -cVar4 & 0x3f;
    local_c0 = (size_t *)local_160.ptr;
    local_d8 = (size_t *)local_188.ptr;
    local_b8 = (size_t *)local_1b0.ptr;
    bVar27 = true;
    sVar10 = local_160.bitContainer;
    while ((puVar24 < puVar11 && (bVar27))) {
      uVar9 = (sVar10 << ((byte)local_160.bitsConsumed & 0x3f)) >> bVar12;
      *local_e8 = (short)DTable[uVar9 + 1];
      iVar19 = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_160.bitsConsumed;
      uVar21 = (sVar10 << ((byte)iVar19 & 0x3f)) >> bVar12;
      uVar9 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
      *(short *)((long)local_e8 + uVar9) = (short)DTable[uVar21 + 1];
      iVar19 = (uint)*(byte *)((long)DTable + uVar21 * 4 + 6) + iVar19;
      uVar21 = (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7);
      uVar22 = (sVar10 << ((byte)iVar19 & 0x3f)) >> bVar12;
      lVar5 = uVar21 + uVar9;
      *(short *)((long)local_e8 + uVar21 + uVar9) = (short)DTable[uVar22 + 1];
      iVar19 = (uint)*(byte *)((long)DTable + uVar22 * 4 + 6) + iVar19;
      uVar18 = (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7);
      uVar9 = (sVar10 << ((byte)iVar19 & 0x3f)) >> bVar12;
      *(short *)((long)local_e8 + uVar18 + lVar5) = (short)DTable[uVar9 + 1];
      local_160.bitsConsumed = (uint)*(byte *)((long)DTable + uVar9 * 4 + 6) + iVar19;
      uVar21 = (local_80 << ((byte)local_188.bitsConsumed & 0x3f)) >> bVar12;
      bVar1 = *(byte *)((long)DTable + uVar9 * 4 + 7);
      *local_d0 = (short)DTable[uVar21 + 1];
      iVar19 = *(byte *)((long)DTable + uVar21 * 4 + 6) + local_188.bitsConsumed;
      uVar21 = (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7);
      uVar22 = (local_80 << ((byte)iVar19 & 0x3f)) >> bVar12;
      *(short *)((long)local_d0 + uVar21) = (short)DTable[uVar22 + 1];
      iVar19 = (uint)*(byte *)((long)DTable + uVar22 * 4 + 6) + iVar19;
      uVar9 = (local_80 << ((byte)iVar19 & 0x3f)) >> bVar12;
      uVar22 = (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7);
      *(short *)((long)local_d0 + uVar22 + uVar21) = (short)DTable[uVar9 + 1];
      lVar6 = uVar22 + uVar21;
      iVar19 = (uint)*(byte *)((long)DTable + uVar9 * 4 + 6) + iVar19;
      uVar21 = (local_80 << ((byte)iVar19 & 0x3f)) >> bVar12;
      uVar9 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
      *(short *)((long)local_d0 + uVar9 + lVar6) = (short)DTable[uVar21 + 1];
      if (local_c0 < local_160.limitPtr) {
        local_e0 = 3;
      }
      else {
        local_c0 = (size_t *)((long)local_c0 - (ulong)(local_160.bitsConsumed >> 3));
        local_160.bitsConsumed = local_160.bitsConsumed & 7;
        sVar10 = *local_c0;
        local_e0 = 0;
        local_160.bitContainer = sVar10;
      }
      local_188.bitsConsumed = iVar19 + (uint)*(byte *)((long)DTable + uVar21 * 4 + 6);
      bVar2 = *(byte *)((long)DTable + uVar21 * 4 + 7);
      if (local_d8 < local_188.limitPtr) {
        iVar19 = 3;
      }
      else {
        local_d8 = (size_t *)((long)local_d8 - (ulong)(local_188.bitsConsumed >> 3));
        local_188.bitsConsumed = local_188.bitsConsumed & 7;
        local_188.bitContainer = *local_d8;
        iVar19 = 0;
        local_80 = local_188.bitContainer;
      }
      uVar21 = (local_c8 << ((byte)local_1b0.bitsConsumed & 0x3f)) >> bVar12;
      *puVar26 = (short)DTable[uVar21 + 1];
      iVar20 = *(byte *)((long)DTable + uVar21 * 4 + 6) + local_1b0.bitsConsumed;
      uVar21 = (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7);
      uVar22 = (local_c8 << ((byte)iVar20 & 0x3f)) >> bVar12;
      *(short *)((long)puVar26 + uVar21) = (short)DTable[uVar22 + 1];
      iVar20 = (uint)*(byte *)((long)DTable + uVar22 * 4 + 6) + iVar20;
      uVar22 = (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7);
      lVar7 = uVar22 + uVar21;
      uVar14 = (local_c8 << ((byte)iVar20 & 0x3f)) >> bVar12;
      *(short *)((long)puVar26 + uVar22 + uVar21) = (short)DTable[uVar14 + 1];
      iVar20 = (uint)*(byte *)((long)DTable + uVar14 * 4 + 6) + iVar20;
      uVar21 = (local_c8 << ((byte)iVar20 & 0x3f)) >> bVar12;
      uVar14 = (ulong)*(byte *)((long)DTable + uVar14 * 4 + 7);
      *(short *)((long)puVar26 + uVar14 + lVar7) = (short)DTable[uVar21 + 1];
      local_dc = (uint)*(byte *)((long)DTable + uVar21 * 4 + 6) + iVar20;
      bVar3 = *(byte *)((long)DTable + uVar21 * 4 + 7);
      uVar21 = (local_88 << ((byte)local_138.bitsConsumed & 0x3f)) >> bVar12;
      *puVar24 = (short)DTable[uVar21 + 1];
      iVar20 = *(byte *)((long)DTable + uVar21 * 4 + 6) + local_138.bitsConsumed;
      uVar22 = (local_88 << ((byte)iVar20 & 0x3f)) >> bVar12;
      uVar21 = (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7);
      *(short *)((long)puVar24 + uVar21) = (short)DTable[uVar22 + 1];
      iVar20 = (uint)*(byte *)((long)DTable + uVar22 * 4 + 6) + iVar20;
      uVar22 = (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7);
      uVar23 = (local_88 << ((byte)iVar20 & 0x3f)) >> bVar12;
      *(short *)((long)puVar24 + uVar22 + uVar21) = (short)DTable[uVar23 + 1];
      lVar8 = uVar22 + uVar21;
      iVar20 = (uint)*(byte *)((long)DTable + uVar23 * 4 + 6) + iVar20;
      uVar21 = (ulong)*(byte *)((long)DTable + uVar23 * 4 + 7);
      uVar22 = (local_88 << ((byte)iVar20 & 0x3f)) >> bVar12;
      *(short *)((long)puVar24 + uVar21 + lVar8) = (short)DTable[uVar22 + 1];
      if (local_b8 < local_1b0.limitPtr) {
        iVar13 = 3;
      }
      else {
        local_b8 = (size_t *)((long)local_b8 - (ulong)(local_dc >> 3));
        local_dc = local_dc & 7;
        local_1b0.bitContainer = *local_b8;
        iVar13 = 0;
        local_c8 = local_1b0.bitContainer;
      }
      local_138.bitsConsumed = iVar20 + (uint)*(byte *)((long)DTable + uVar22 * 4 + 6);
      if (local_138.ptr < local_138.limitPtr) {
        iVar20 = 3;
        local_b0 = (size_t *)local_138.ptr;
      }
      else {
        local_b0 = (size_t *)((long)local_138.ptr - (ulong)(local_138.bitsConsumed >> 3));
        local_138.bitsConsumed = local_138.bitsConsumed & 7;
        local_138.bitContainer = *local_b0;
        iVar20 = 0;
        local_88 = local_138.bitContainer;
      }
      local_e8 = (undefined2 *)((long)local_e8 + (ulong)bVar1 + uVar18 + lVar5);
      local_d0 = (undefined2 *)((long)local_d0 + (ulong)bVar2 + uVar9 + lVar6);
      puVar26 = (undefined2 *)((long)puVar26 + (ulong)bVar3 + uVar14 + lVar7);
      puVar24 = (undefined2 *)
                ((long)puVar24 + (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7) + uVar21 + lVar8);
      bVar27 = ((iVar19 == 0 && local_e0 == 0) && iVar13 == 0) && iVar20 == 0;
      local_138.ptr = (char *)local_b0;
      local_1b0.bitsConsumed = local_dc;
    }
    local_160.ptr = (char *)local_c0;
    local_188.ptr = (char *)local_d8;
    local_1b0.ptr = (char *)local_b8;
  }
  if (local_100 < local_e8) {
    return 0xffffffffffffffec;
  }
  if (local_110 < local_d0) {
    return 0xffffffffffffffec;
  }
  if (local_108 < puVar26) {
    return 0xffffffffffffffec;
  }
  uVar16 = local_f4 >> 0x10 & 0xff;
  iVar19 = (int)local_160.start;
  if ((ulong)((long)local_100 - (long)local_e8) < 8) {
    uVar9 = (ulong)local_160.bitsConsumed;
    if (uVar9 < 0x41) {
      if (local_160.ptr < local_160.limitPtr) {
        if (local_160.ptr == local_160.start) goto LAB_0016c199;
        uVar15 = (int)local_160.ptr - iVar19;
        if (local_160.start <=
            (size_t *)((long)local_160.ptr - (ulong)(local_160.bitsConsumed >> 3))) {
          uVar15 = local_160.bitsConsumed >> 3;
        }
        local_160.bitsConsumed = local_160.bitsConsumed + uVar15 * -8;
      }
      else {
        uVar15 = local_160.bitsConsumed >> 3;
        local_160.bitsConsumed = local_160.bitsConsumed & 7;
      }
      local_160.ptr = (char *)((long)local_160.ptr - (ulong)uVar15);
      uVar9 = (ulong)local_160.bitsConsumed;
      local_160.bitContainer = *(size_t *)local_160.ptr;
    }
  }
  else {
    bVar12 = -cVar4 & 0x3f;
    uVar9 = (ulong)local_160.bitsConsumed;
    if (uVar16 < 0xc) {
      while (uVar15 = (uint)uVar9, uVar15 < 0x41) {
        if (local_160.ptr < local_160.limitPtr) {
          if (local_160.ptr == local_160.start) break;
          bVar27 = local_160.start <= (size_t *)((long)local_160.ptr - (uVar9 >> 3));
          uVar21 = (ulong)(uint)((int)local_160.ptr - iVar19);
          if (bVar27) {
            uVar21 = uVar9 >> 3;
          }
          local_160.bitsConsumed = uVar15 + (int)uVar21 * -8;
        }
        else {
          uVar21 = uVar9 >> 3;
          local_160.bitsConsumed = uVar15 & 7;
          bVar27 = true;
        }
        local_160.ptr = (char *)((long)local_160.ptr - uVar21);
        uVar9 = (ulong)local_160.bitsConsumed;
        local_160.bitContainer = *(size_t *)local_160.ptr;
        if (((undefined2 *)((long)local_100 + -9) <= local_e8) || (!bVar27)) break;
        uVar9 = (local_160.bitContainer << ((byte)local_160.bitsConsumed & 0x3f)) >> bVar12;
        *local_e8 = (short)DTable[uVar9 + 1];
        iVar20 = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_160.bitsConsumed;
        uVar21 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
        uVar9 = (local_160.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
        *(short *)((long)local_e8 + uVar21) = (short)DTable[uVar9 + 1];
        iVar20 = (uint)*(byte *)((long)DTable + uVar9 * 4 + 6) + iVar20;
        uVar22 = (local_160.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
        lVar5 = uVar9 + uVar21;
        *(short *)((long)local_e8 + uVar9 + uVar21) = (short)DTable[uVar22 + 1];
        iVar20 = (uint)*(byte *)((long)DTable + uVar22 * 4 + 6) + iVar20;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7);
        lVar6 = uVar9 + lVar5;
        uVar21 = (local_160.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
        *(short *)((long)local_e8 + uVar9 + lVar5) = (short)DTable[uVar21 + 1];
        iVar20 = (uint)*(byte *)((long)DTable + uVar21 * 4 + 6) + iVar20;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7);
        uVar21 = (local_160.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
        *(short *)((long)local_e8 + uVar9 + lVar6) = (short)DTable[uVar21 + 1];
        local_160.bitsConsumed = (uint)*(byte *)((long)DTable + uVar21 * 4 + 6) + iVar20;
        local_e8 = (undefined2 *)
                   ((long)local_e8 + (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7) + uVar9 + lVar6
                   );
        uVar9 = (ulong)local_160.bitsConsumed;
      }
    }
    else {
      while (uVar15 = (uint)uVar9, uVar15 < 0x41) {
        if (local_160.ptr < local_160.limitPtr) {
          if (local_160.ptr == local_160.start) break;
          bVar27 = local_160.start <= (size_t *)((long)local_160.ptr - (uVar9 >> 3));
          uVar21 = (ulong)(uint)((int)local_160.ptr - iVar19);
          if (bVar27) {
            uVar21 = uVar9 >> 3;
          }
          local_160.bitsConsumed = uVar15 + (int)uVar21 * -8;
        }
        else {
          uVar21 = uVar9 >> 3;
          local_160.bitsConsumed = uVar15 & 7;
          bVar27 = true;
        }
        local_160.ptr = (char *)((long)local_160.ptr - uVar21);
        uVar9 = (ulong)local_160.bitsConsumed;
        local_160.bitContainer = *(size_t *)local_160.ptr;
        if (((undefined2 *)((long)local_100 + -7) <= local_e8) || (!bVar27)) break;
        uVar9 = (local_160.bitContainer << ((byte)local_160.bitsConsumed & 0x3f)) >> bVar12;
        *local_e8 = (short)DTable[uVar9 + 1];
        iVar20 = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_160.bitsConsumed;
        uVar21 = (local_160.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
        *(short *)((long)local_e8 + uVar9) = (short)DTable[uVar21 + 1];
        iVar20 = (uint)*(byte *)((long)DTable + uVar21 * 4 + 6) + iVar20;
        uVar21 = (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7);
        lVar5 = uVar21 + uVar9;
        uVar22 = (local_160.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
        *(short *)((long)local_e8 + uVar21 + uVar9) = (short)DTable[uVar22 + 1];
        iVar20 = (uint)*(byte *)((long)DTable + uVar22 * 4 + 6) + iVar20;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7);
        uVar21 = (local_160.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
        *(short *)((long)local_e8 + uVar9 + lVar5) = (short)DTable[uVar21 + 1];
        local_160.bitsConsumed = (uint)*(byte *)((long)DTable + uVar21 * 4 + 6) + iVar20;
        local_e8 = (undefined2 *)
                   ((long)local_e8 + (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7) + uVar9 + lVar5
                   );
        uVar9 = (ulong)local_160.bitsConsumed;
      }
    }
  }
LAB_0016c199:
  if (1 < (ulong)((long)local_100 - (long)local_e8)) {
    while (uVar15 = (uint)uVar9, uVar15 < 0x41) {
      if (local_160.ptr < local_160.limitPtr) {
        if (local_160.ptr == local_160.start) break;
        bVar27 = local_160.start <= (size_t *)((long)local_160.ptr - (uVar9 >> 3));
        uVar21 = (ulong)(uint)((int)local_160.ptr - iVar19);
        if (bVar27) {
          uVar21 = uVar9 >> 3;
        }
        local_160.bitsConsumed = uVar15 + (int)uVar21 * -8;
      }
      else {
        uVar21 = uVar9 >> 3;
        local_160.bitsConsumed = uVar15 & 7;
        bVar27 = true;
      }
      local_160.ptr = (char *)((long)local_160.ptr - uVar21);
      uVar9 = (ulong)local_160.bitsConsumed;
      local_160.bitContainer = *(size_t *)local_160.ptr;
      if ((local_100 + -1 < local_e8) || (!bVar27)) break;
      uVar9 = (local_160.bitContainer << ((byte)local_160.bitsConsumed & 0x3f)) >> (-cVar4 & 0x3fU);
      *local_e8 = (short)DTable[uVar9 + 1];
      local_160.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_160.bitsConsumed;
      local_e8 = (undefined2 *)((long)local_e8 + (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7));
      uVar9 = (ulong)local_160.bitsConsumed;
    }
    for (; local_e8 <= local_100 + -1;
        local_e8 = (undefined2 *)((long)local_e8 + (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7)))
    {
      uVar21 = (local_160.bitContainer << ((byte)uVar9 & 0x3f)) >> (-cVar4 & 0x3fU);
      *local_e8 = (short)DTable[uVar21 + 1];
      local_160.bitsConsumed = *(byte *)((long)DTable + uVar21 * 4 + 6) + local_160.bitsConsumed;
      uVar9 = (ulong)local_160.bitsConsumed;
    }
  }
  uVar15 = 0x40;
  if (local_e8 < local_100) {
    uVar9 = (local_160.bitContainer << ((byte)uVar9 & 0x3f)) >> (-cVar4 & 0x3fU);
    *(char *)local_e8 = (char)DTable[uVar9 + 1];
    if (*(char *)((long)DTable + uVar9 * 4 + 7) == '\x01') {
      local_160.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_160.bitsConsumed;
    }
    else if ((local_160.bitsConsumed < 0x40) &&
            (local_160.bitsConsumed =
                  local_160.bitsConsumed + *(byte *)((long)DTable + uVar9 * 4 + 6),
            0x3f < local_160.bitsConsumed)) {
      local_160.bitsConsumed = uVar15;
    }
  }
  iVar19 = (int)local_188.start;
  if ((ulong)((long)local_110 - (long)local_d0) < 8) {
    uVar9 = (ulong)local_188.bitsConsumed;
    if (uVar9 < 0x41) {
      if (local_188.ptr < local_188.limitPtr) {
        if (local_188.ptr == local_188.start) goto LAB_0016c65a;
        uVar17 = (int)local_188.ptr - iVar19;
        if (local_188.start <=
            (size_t *)((long)local_188.ptr - (ulong)(local_188.bitsConsumed >> 3))) {
          uVar17 = local_188.bitsConsumed >> 3;
        }
        local_188.bitsConsumed = local_188.bitsConsumed + uVar17 * -8;
      }
      else {
        uVar17 = local_188.bitsConsumed >> 3;
        local_188.bitsConsumed = local_188.bitsConsumed & 7;
      }
      local_188.ptr = (char *)((long)local_188.ptr - (ulong)uVar17);
      uVar9 = (ulong)local_188.bitsConsumed;
      local_188.bitContainer = *(size_t *)local_188.ptr;
    }
  }
  else {
    bVar12 = -cVar4 & 0x3f;
    uVar9 = (ulong)local_188.bitsConsumed;
    if (uVar16 < 0xc) {
      while (uVar17 = (uint)uVar9, uVar17 < 0x41) {
        if (local_188.ptr < local_188.limitPtr) {
          if (local_188.ptr == local_188.start) break;
          bVar27 = local_188.start <= (size_t *)((long)local_188.ptr - (uVar9 >> 3));
          uVar21 = (ulong)(uint)((int)local_188.ptr - iVar19);
          if (bVar27) {
            uVar21 = uVar9 >> 3;
          }
          local_188.bitsConsumed = uVar17 + (int)uVar21 * -8;
        }
        else {
          uVar21 = uVar9 >> 3;
          local_188.bitsConsumed = uVar17 & 7;
          bVar27 = true;
        }
        local_188.ptr = (char *)((long)local_188.ptr - uVar21);
        uVar9 = (ulong)local_188.bitsConsumed;
        local_188.bitContainer = *(size_t *)local_188.ptr;
        if (((undefined2 *)((long)local_110 + -9) <= local_d0) || (!bVar27)) break;
        uVar9 = (local_188.bitContainer << ((byte)local_188.bitsConsumed & 0x3f)) >> bVar12;
        *local_d0 = (short)DTable[uVar9 + 1];
        iVar20 = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_188.bitsConsumed;
        uVar21 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
        uVar9 = (local_188.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
        *(short *)((long)local_d0 + uVar21) = (short)DTable[uVar9 + 1];
        iVar20 = (uint)*(byte *)((long)DTable + uVar9 * 4 + 6) + iVar20;
        uVar22 = (local_188.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
        lVar5 = uVar9 + uVar21;
        *(short *)((long)local_d0 + uVar9 + uVar21) = (short)DTable[uVar22 + 1];
        iVar20 = (uint)*(byte *)((long)DTable + uVar22 * 4 + 6) + iVar20;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7);
        lVar6 = uVar9 + lVar5;
        uVar21 = (local_188.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
        *(short *)((long)local_d0 + uVar9 + lVar5) = (short)DTable[uVar21 + 1];
        iVar20 = (uint)*(byte *)((long)DTable + uVar21 * 4 + 6) + iVar20;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7);
        uVar21 = (local_188.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
        *(short *)((long)local_d0 + uVar9 + lVar6) = (short)DTable[uVar21 + 1];
        local_188.bitsConsumed = (uint)*(byte *)((long)DTable + uVar21 * 4 + 6) + iVar20;
        local_d0 = (undefined2 *)
                   ((long)local_d0 + (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7) + uVar9 + lVar6
                   );
        uVar9 = (ulong)local_188.bitsConsumed;
      }
    }
    else {
      while (uVar17 = (uint)uVar9, uVar17 < 0x41) {
        if (local_188.ptr < local_188.limitPtr) {
          if (local_188.ptr == local_188.start) break;
          bVar27 = local_188.start <= (size_t *)((long)local_188.ptr - (uVar9 >> 3));
          uVar21 = (ulong)(uint)((int)local_188.ptr - iVar19);
          if (bVar27) {
            uVar21 = uVar9 >> 3;
          }
          local_188.bitsConsumed = uVar17 + (int)uVar21 * -8;
        }
        else {
          uVar21 = uVar9 >> 3;
          local_188.bitsConsumed = uVar17 & 7;
          bVar27 = true;
        }
        local_188.ptr = (char *)((long)local_188.ptr - uVar21);
        uVar9 = (ulong)local_188.bitsConsumed;
        local_188.bitContainer = *(size_t *)local_188.ptr;
        if (((undefined2 *)((long)local_110 + -7) <= local_d0) || (!bVar27)) break;
        uVar9 = (local_188.bitContainer << ((byte)local_188.bitsConsumed & 0x3f)) >> bVar12;
        *local_d0 = (short)DTable[uVar9 + 1];
        iVar20 = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_188.bitsConsumed;
        uVar21 = (local_188.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
        *(short *)((long)local_d0 + uVar9) = (short)DTable[uVar21 + 1];
        iVar20 = (uint)*(byte *)((long)DTable + uVar21 * 4 + 6) + iVar20;
        uVar21 = (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7);
        lVar5 = uVar21 + uVar9;
        uVar22 = (local_188.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
        *(short *)((long)local_d0 + uVar21 + uVar9) = (short)DTable[uVar22 + 1];
        iVar20 = (uint)*(byte *)((long)DTable + uVar22 * 4 + 6) + iVar20;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7);
        uVar21 = (local_188.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
        *(short *)((long)local_d0 + uVar9 + lVar5) = (short)DTable[uVar21 + 1];
        local_188.bitsConsumed = (uint)*(byte *)((long)DTable + uVar21 * 4 + 6) + iVar20;
        local_d0 = (undefined2 *)
                   ((long)local_d0 + (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7) + uVar9 + lVar5
                   );
        uVar9 = (ulong)local_188.bitsConsumed;
      }
    }
  }
LAB_0016c65a:
  if (1 < (ulong)((long)local_110 - (long)local_d0)) {
    while (uVar17 = (uint)uVar9, uVar17 < 0x41) {
      if (local_188.ptr < local_188.limitPtr) {
        if (local_188.ptr == local_188.start) break;
        bVar27 = local_188.start <= (size_t *)((long)local_188.ptr - (uVar9 >> 3));
        uVar21 = (ulong)(uint)((int)local_188.ptr - iVar19);
        if (bVar27) {
          uVar21 = uVar9 >> 3;
        }
        local_188.bitsConsumed = uVar17 + (int)uVar21 * -8;
      }
      else {
        uVar21 = uVar9 >> 3;
        local_188.bitsConsumed = uVar17 & 7;
        bVar27 = true;
      }
      local_188.ptr = (char *)((long)local_188.ptr - uVar21);
      uVar9 = (ulong)local_188.bitsConsumed;
      local_188.bitContainer = *(size_t *)local_188.ptr;
      if ((local_110 + -1 < local_d0) || (!bVar27)) break;
      uVar9 = (local_188.bitContainer << ((byte)local_188.bitsConsumed & 0x3f)) >> (-cVar4 & 0x3fU);
      *local_d0 = (short)DTable[uVar9 + 1];
      local_188.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_188.bitsConsumed;
      local_d0 = (undefined2 *)((long)local_d0 + (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7));
      uVar9 = (ulong)local_188.bitsConsumed;
    }
    for (; local_d0 <= local_110 + -1;
        local_d0 = (undefined2 *)((long)local_d0 + (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7)))
    {
      uVar21 = (local_188.bitContainer << ((byte)uVar9 & 0x3f)) >> (-cVar4 & 0x3fU);
      *local_d0 = (short)DTable[uVar21 + 1];
      local_188.bitsConsumed = *(byte *)((long)DTable + uVar21 * 4 + 6) + local_188.bitsConsumed;
      uVar9 = (ulong)local_188.bitsConsumed;
    }
  }
  if (local_d0 < local_110) {
    uVar9 = (local_188.bitContainer << ((byte)uVar9 & 0x3f)) >> (-cVar4 & 0x3fU);
    *(char *)local_d0 = (char)DTable[uVar9 + 1];
    if (*(char *)((long)DTable + uVar9 * 4 + 7) == '\x01') {
      local_188.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_188.bitsConsumed;
    }
    else if ((local_188.bitsConsumed < 0x40) &&
            (local_188.bitsConsumed =
                  local_188.bitsConsumed + *(byte *)((long)DTable + uVar9 * 4 + 6),
            0x3f < local_188.bitsConsumed)) {
      local_188.bitsConsumed = uVar15;
    }
  }
  iVar19 = (int)local_1b0.start;
  if ((ulong)((long)local_108 - (long)puVar26) < 8) {
    uVar9 = (ulong)local_1b0.bitsConsumed;
    if (uVar9 < 0x41) {
      if (local_1b0.ptr < local_1b0.limitPtr) {
        if (local_1b0.ptr == local_1b0.start) goto LAB_0016cb07;
        uVar17 = (int)local_1b0.ptr - iVar19;
        if (local_1b0.start <=
            (size_t *)((long)local_1b0.ptr - (ulong)(local_1b0.bitsConsumed >> 3))) {
          uVar17 = local_1b0.bitsConsumed >> 3;
        }
        local_1b0.bitsConsumed = local_1b0.bitsConsumed + uVar17 * -8;
      }
      else {
        uVar17 = local_1b0.bitsConsumed >> 3;
        local_1b0.bitsConsumed = local_1b0.bitsConsumed & 7;
      }
      local_1b0.ptr = (char *)((long)local_1b0.ptr - (ulong)uVar17);
      uVar9 = (ulong)local_1b0.bitsConsumed;
      local_1b0.bitContainer = *(size_t *)local_1b0.ptr;
    }
  }
  else {
    bVar12 = -cVar4 & 0x3f;
    uVar9 = (ulong)local_1b0.bitsConsumed;
    if (uVar16 < 0xc) {
      while (uVar17 = (uint)uVar9, uVar17 < 0x41) {
        if (local_1b0.ptr < local_1b0.limitPtr) {
          if (local_1b0.ptr == local_1b0.start) break;
          bVar27 = local_1b0.start <= (size_t *)((long)local_1b0.ptr - (uVar9 >> 3));
          uVar21 = (ulong)(uint)((int)local_1b0.ptr - iVar19);
          if (bVar27) {
            uVar21 = uVar9 >> 3;
          }
          local_1b0.bitsConsumed = uVar17 + (int)uVar21 * -8;
        }
        else {
          uVar21 = uVar9 >> 3;
          local_1b0.bitsConsumed = uVar17 & 7;
          bVar27 = true;
        }
        local_1b0.ptr = (char *)((long)local_1b0.ptr - uVar21);
        uVar9 = (ulong)local_1b0.bitsConsumed;
        local_1b0.bitContainer = *(size_t *)local_1b0.ptr;
        if (((undefined2 *)((long)local_108 + -9) <= puVar26) || (!bVar27)) break;
        uVar9 = (local_1b0.bitContainer << ((byte)local_1b0.bitsConsumed & 0x3f)) >> bVar12;
        *puVar26 = (short)DTable[uVar9 + 1];
        iVar20 = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_1b0.bitsConsumed;
        uVar21 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
        uVar9 = (local_1b0.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
        *(short *)((long)puVar26 + uVar21) = (short)DTable[uVar9 + 1];
        iVar20 = (uint)*(byte *)((long)DTable + uVar9 * 4 + 6) + iVar20;
        uVar22 = (local_1b0.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
        lVar5 = uVar9 + uVar21;
        *(short *)((long)puVar26 + uVar9 + uVar21) = (short)DTable[uVar22 + 1];
        iVar20 = (uint)*(byte *)((long)DTable + uVar22 * 4 + 6) + iVar20;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7);
        lVar6 = uVar9 + lVar5;
        uVar21 = (local_1b0.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
        *(short *)((long)puVar26 + uVar9 + lVar5) = (short)DTable[uVar21 + 1];
        iVar20 = (uint)*(byte *)((long)DTable + uVar21 * 4 + 6) + iVar20;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7);
        uVar21 = (local_1b0.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
        *(short *)((long)puVar26 + uVar9 + lVar6) = (short)DTable[uVar21 + 1];
        local_1b0.bitsConsumed = (uint)*(byte *)((long)DTable + uVar21 * 4 + 6) + iVar20;
        puVar26 = (undefined2 *)
                  ((long)puVar26 + (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7) + uVar9 + lVar6);
        uVar9 = (ulong)local_1b0.bitsConsumed;
      }
    }
    else {
      while (uVar17 = (uint)uVar9, uVar17 < 0x41) {
        if (local_1b0.ptr < local_1b0.limitPtr) {
          if (local_1b0.ptr == local_1b0.start) break;
          bVar27 = local_1b0.start <= (size_t *)((long)local_1b0.ptr - (uVar9 >> 3));
          uVar21 = (ulong)(uint)((int)local_1b0.ptr - iVar19);
          if (bVar27) {
            uVar21 = uVar9 >> 3;
          }
          local_1b0.bitsConsumed = uVar17 + (int)uVar21 * -8;
        }
        else {
          uVar21 = uVar9 >> 3;
          local_1b0.bitsConsumed = uVar17 & 7;
          bVar27 = true;
        }
        local_1b0.ptr = (char *)((long)local_1b0.ptr - uVar21);
        uVar9 = (ulong)local_1b0.bitsConsumed;
        local_1b0.bitContainer = *(size_t *)local_1b0.ptr;
        if (((undefined2 *)((long)local_108 + -7) <= puVar26) || (!bVar27)) break;
        uVar9 = (local_1b0.bitContainer << ((byte)local_1b0.bitsConsumed & 0x3f)) >> bVar12;
        *puVar26 = (short)DTable[uVar9 + 1];
        iVar20 = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_1b0.bitsConsumed;
        uVar21 = (local_1b0.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
        *(short *)((long)puVar26 + uVar9) = (short)DTable[uVar21 + 1];
        iVar20 = (uint)*(byte *)((long)DTable + uVar21 * 4 + 6) + iVar20;
        uVar21 = (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7);
        lVar5 = uVar21 + uVar9;
        uVar22 = (local_1b0.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
        *(short *)((long)puVar26 + uVar21 + uVar9) = (short)DTable[uVar22 + 1];
        iVar20 = (uint)*(byte *)((long)DTable + uVar22 * 4 + 6) + iVar20;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7);
        uVar21 = (local_1b0.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
        *(short *)((long)puVar26 + uVar9 + lVar5) = (short)DTable[uVar21 + 1];
        local_1b0.bitsConsumed = (uint)*(byte *)((long)DTable + uVar21 * 4 + 6) + iVar20;
        puVar26 = (undefined2 *)
                  ((long)puVar26 + (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7) + uVar9 + lVar5);
        uVar9 = (ulong)local_1b0.bitsConsumed;
      }
    }
  }
LAB_0016cb07:
  if (1 < (ulong)((long)local_108 - (long)puVar26)) {
    while (uVar17 = (uint)uVar9, uVar17 < 0x41) {
      if (local_1b0.ptr < local_1b0.limitPtr) {
        if (local_1b0.ptr == local_1b0.start) break;
        bVar27 = local_1b0.start <= (size_t *)((long)local_1b0.ptr - (uVar9 >> 3));
        uVar21 = (ulong)(uint)((int)local_1b0.ptr - iVar19);
        if (bVar27) {
          uVar21 = uVar9 >> 3;
        }
        local_1b0.bitsConsumed = uVar17 + (int)uVar21 * -8;
      }
      else {
        uVar21 = uVar9 >> 3;
        local_1b0.bitsConsumed = uVar17 & 7;
        bVar27 = true;
      }
      local_1b0.ptr = (char *)((long)local_1b0.ptr - uVar21);
      uVar9 = (ulong)local_1b0.bitsConsumed;
      local_1b0.bitContainer = *(size_t *)local_1b0.ptr;
      if ((local_108 + -1 < puVar26) || (!bVar27)) break;
      uVar9 = (local_1b0.bitContainer << ((byte)local_1b0.bitsConsumed & 0x3f)) >> (-cVar4 & 0x3fU);
      *puVar26 = (short)DTable[uVar9 + 1];
      local_1b0.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_1b0.bitsConsumed;
      puVar26 = (undefined2 *)((long)puVar26 + (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7));
      uVar9 = (ulong)local_1b0.bitsConsumed;
    }
    for (; puVar26 <= local_108 + -1;
        puVar26 = (undefined2 *)((long)puVar26 + (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7))) {
      uVar21 = (local_1b0.bitContainer << ((byte)uVar9 & 0x3f)) >> (-cVar4 & 0x3fU);
      *puVar26 = (short)DTable[uVar21 + 1];
      local_1b0.bitsConsumed = *(byte *)((long)DTable + uVar21 * 4 + 6) + local_1b0.bitsConsumed;
      uVar9 = (ulong)local_1b0.bitsConsumed;
    }
  }
  if (puVar26 < local_108) {
    uVar9 = (local_1b0.bitContainer << ((byte)uVar9 & 0x3f)) >> (-cVar4 & 0x3fU);
    *(char *)puVar26 = (char)DTable[uVar9 + 1];
    if (*(char *)((long)DTable + uVar9 * 4 + 7) == '\x01') {
      local_1b0.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_1b0.bitsConsumed;
    }
    else if ((local_1b0.bitsConsumed < 0x40) &&
            (local_1b0.bitsConsumed =
                  local_1b0.bitsConsumed + *(byte *)((long)DTable + uVar9 * 4 + 6),
            0x3f < local_1b0.bitsConsumed)) {
      local_1b0.bitsConsumed = uVar15;
    }
  }
  iVar19 = (int)local_138.start;
  if ((ulong)((long)local_f0 - (long)puVar24) < 8) {
    uVar9 = (ulong)local_138.bitsConsumed;
    if (uVar9 < 0x41) {
      if (local_138.ptr < local_138.limitPtr) {
        if (local_138.ptr == local_138.start) goto LAB_0016d049;
        uVar16 = (int)local_138.ptr - iVar19;
        if (local_138.start <=
            (size_t *)((long)local_138.ptr - (ulong)(local_138.bitsConsumed >> 3))) {
          uVar16 = local_138.bitsConsumed >> 3;
        }
        local_138.bitsConsumed = local_138.bitsConsumed + uVar16 * -8;
      }
      else {
        uVar16 = local_138.bitsConsumed >> 3;
        local_138.bitsConsumed = local_138.bitsConsumed & 7;
      }
      local_138.ptr = (char *)((long)local_138.ptr - (ulong)uVar16);
      uVar9 = (ulong)local_138.bitsConsumed;
      local_138.bitContainer = *(size_t *)local_138.ptr;
    }
  }
  else if (uVar16 < 0xc) {
    bVar12 = -cVar4 & 0x3f;
    while (uVar9 = (ulong)local_138.bitsConsumed, local_138.bitsConsumed < 0x41) {
      if (local_138.ptr < local_138.limitPtr) {
        if (local_138.ptr == local_138.start) break;
        bVar27 = local_138.start <=
                 (size_t *)((long)local_138.ptr - (ulong)(local_138.bitsConsumed >> 3));
        uVar9 = (ulong)(uint)((int)local_138.ptr - iVar19);
        if (bVar27) {
          uVar9 = (ulong)(local_138.bitsConsumed >> 3);
        }
        local_138.bitsConsumed = local_138.bitsConsumed + (int)uVar9 * -8;
      }
      else {
        uVar9 = (ulong)(local_138.bitsConsumed >> 3);
        local_138.bitsConsumed = local_138.bitsConsumed & 7;
        bVar27 = true;
      }
      local_138.ptr = (char *)((long)local_138.ptr - uVar9);
      uVar9 = (ulong)local_138.bitsConsumed;
      local_138.bitContainer = *(size_t *)local_138.ptr;
      if (((undefined2 *)((long)local_f0 - 9U) <= puVar24) || (!bVar27)) break;
      uVar9 = (local_138.bitContainer << ((byte)local_138.bitsConsumed & 0x3f)) >> bVar12;
      *puVar24 = (short)DTable[uVar9 + 1];
      iVar20 = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_138.bitsConsumed;
      uVar21 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
      uVar9 = (local_138.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
      *(short *)((long)puVar24 + uVar21) = (short)DTable[uVar9 + 1];
      iVar20 = (uint)*(byte *)((long)DTable + uVar9 * 4 + 6) + iVar20;
      uVar22 = (local_138.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
      uVar9 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
      lVar5 = uVar9 + uVar21;
      *(short *)((long)puVar24 + uVar9 + uVar21) = (short)DTable[uVar22 + 1];
      iVar20 = (uint)*(byte *)((long)DTable + uVar22 * 4 + 6) + iVar20;
      uVar9 = (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7);
      lVar6 = uVar9 + lVar5;
      uVar21 = (local_138.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
      *(short *)((long)puVar24 + uVar9 + lVar5) = (short)DTable[uVar21 + 1];
      iVar20 = (uint)*(byte *)((long)DTable + uVar21 * 4 + 6) + iVar20;
      uVar9 = (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7);
      uVar21 = (local_138.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
      *(short *)((long)puVar24 + uVar9 + lVar6) = (short)DTable[uVar21 + 1];
      puVar24 = (undefined2 *)
                ((long)puVar24 + (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7) + uVar9 + lVar6);
      local_138.bitsConsumed = (uint)*(byte *)((long)DTable + uVar21 * 4 + 6) + iVar20;
    }
  }
  else {
    bVar12 = -cVar4 & 0x3f;
    while (uVar9 = (ulong)local_138.bitsConsumed, local_138.bitsConsumed < 0x41) {
      if (local_138.ptr < local_138.limitPtr) {
        if (local_138.ptr == local_138.start) break;
        bVar27 = local_138.start <=
                 (size_t *)((long)local_138.ptr - (ulong)(local_138.bitsConsumed >> 3));
        uVar9 = (ulong)(uint)((int)local_138.ptr - iVar19);
        if (bVar27) {
          uVar9 = (ulong)(local_138.bitsConsumed >> 3);
        }
        local_138.bitsConsumed = local_138.bitsConsumed + (int)uVar9 * -8;
      }
      else {
        uVar9 = (ulong)(local_138.bitsConsumed >> 3);
        local_138.bitsConsumed = local_138.bitsConsumed & 7;
        bVar27 = true;
      }
      local_138.ptr = (char *)((long)local_138.ptr - uVar9);
      uVar9 = (ulong)local_138.bitsConsumed;
      local_138.bitContainer = *(size_t *)local_138.ptr;
      if ((puVar11 <= puVar24) || (!bVar27)) break;
      uVar9 = (local_138.bitContainer << ((byte)local_138.bitsConsumed & 0x3f)) >> bVar12;
      *puVar24 = (short)DTable[uVar9 + 1];
      iVar20 = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_138.bitsConsumed;
      uVar21 = (local_138.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
      uVar9 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
      *(short *)((long)puVar24 + uVar9) = (short)DTable[uVar21 + 1];
      iVar20 = (uint)*(byte *)((long)DTable + uVar21 * 4 + 6) + iVar20;
      uVar21 = (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7);
      lVar5 = uVar21 + uVar9;
      uVar22 = (local_138.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
      *(short *)((long)puVar24 + uVar21 + uVar9) = (short)DTable[uVar22 + 1];
      iVar20 = (uint)*(byte *)((long)DTable + uVar22 * 4 + 6) + iVar20;
      uVar9 = (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7);
      uVar21 = (local_138.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
      *(short *)((long)puVar24 + uVar9 + lVar5) = (short)DTable[uVar21 + 1];
      puVar24 = (undefined2 *)
                ((long)puVar24 + (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7) + uVar9 + lVar5);
      local_138.bitsConsumed = (uint)*(byte *)((long)DTable + uVar21 * 4 + 6) + iVar20;
    }
  }
LAB_0016d049:
  uVar16 = (uint)uVar9;
  if (1 < (ulong)((long)local_f0 - (long)puVar24)) {
    while (uVar16 = (uint)uVar9, uVar16 < 0x41) {
      if (local_138.ptr < local_138.limitPtr) {
        if (local_138.ptr == local_138.start) break;
        bVar27 = local_138.start <= (size_t *)((long)local_138.ptr - (uVar9 >> 3));
        uVar21 = (ulong)(uint)((int)local_138.ptr - iVar19);
        if (bVar27) {
          uVar21 = uVar9 >> 3;
        }
        local_138.bitsConsumed = uVar16 + (int)uVar21 * -8;
      }
      else {
        uVar21 = uVar9 >> 3;
        local_138.bitsConsumed = uVar16 & 7;
        bVar27 = true;
      }
      local_138.ptr = (char *)((long)local_138.ptr - uVar21);
      uVar9 = (ulong)local_138.bitsConsumed;
      local_138.bitContainer = *(size_t *)local_138.ptr;
      if ((local_f0 + -1 < puVar24) || (!bVar27)) break;
      uVar9 = (local_138.bitContainer << ((byte)local_138.bitsConsumed & 0x3f)) >> (-cVar4 & 0x3fU);
      *puVar24 = (short)DTable[uVar9 + 1];
      local_138.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_138.bitsConsumed;
      puVar24 = (undefined2 *)((long)puVar24 + (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7));
      uVar9 = (ulong)local_138.bitsConsumed;
    }
    for (; uVar16 = (uint)uVar9, puVar24 <= local_f0 + -1;
        puVar24 = (undefined2 *)((long)puVar24 + (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7))) {
      uVar21 = (local_138.bitContainer << ((byte)uVar9 & 0x3f)) >> (-cVar4 & 0x3fU);
      *puVar24 = (short)DTable[uVar21 + 1];
      local_138.bitsConsumed = *(byte *)((long)DTable + uVar21 * 4 + 6) + local_138.bitsConsumed;
      uVar9 = (ulong)local_138.bitsConsumed;
    }
  }
  if (puVar24 < local_f0) {
    uVar9 = (local_138.bitContainer << ((byte)uVar16 & 0x3f)) >> (-cVar4 & 0x3fU);
    *(char *)puVar24 = (char)DTable[uVar9 + 1];
    if (*(char *)((long)DTable + uVar9 * 4 + 7) == '\x01') {
      uVar16 = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_138.bitsConsumed;
    }
    else {
      uVar16 = local_138.bitsConsumed;
      if ((local_138.bitsConsumed < 0x40) &&
         (local_138.bitsConsumed = local_138.bitsConsumed + *(byte *)((long)DTable + uVar9 * 4 + 6),
         uVar16 = uVar15, local_138.bitsConsumed < 0x40)) {
        uVar16 = local_138.bitsConsumed;
      }
    }
  }
  sVar10 = 0xffffffffffffffec;
  if (uVar16 != 0x40) {
    local_98 = sVar10;
  }
  if (local_138.ptr != local_138.start) {
    local_98 = sVar10;
  }
  if (local_1b0.bitsConsumed != 0x40) {
    local_98 = sVar10;
  }
  if (local_1b0.ptr != local_1b0.start) {
    local_98 = sVar10;
  }
  if (local_188.bitsConsumed != 0x40) {
    local_98 = sVar10;
  }
  if (local_188.ptr != local_188.start) {
    local_98 = sVar10;
  }
  if (local_160.bitsConsumed != 0x40) {
    local_98 = sVar10;
  }
  if (local_160.ptr != local_160.start) {
    local_98 = sVar10;
  }
  return local_98;
}

Assistant:

static size_t HUF_decompress4X2_usingDTable_internal(void* dst, size_t dstSize, void const* cSrc,
                    size_t cSrcSize, HUF_DTable const* DTable, int flags)
{
    HUF_DecompressUsingDTableFn fallbackFn = HUF_decompress4X2_usingDTable_internal_default;
    HUF_DecompressFastLoopFn loopFn = HUF_decompress4X2_usingDTable_internal_fast_c_loop;

#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        fallbackFn = HUF_decompress4X2_usingDTable_internal_bmi2;
# if ZSTD_ENABLE_ASM_X86_64_BMI2
        if (!(flags & HUF_flags_disableAsm)) {
            loopFn = HUF_decompress4X2_usingDTable_internal_fast_asm_loop;
        }
# endif
    } else {
        return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
    }
#endif

#if ZSTD_ENABLE_ASM_X86_64_BMI2 && defined(__BMI2__)
    if (!(flags & HUF_flags_disableAsm)) {
        loopFn = HUF_decompress4X2_usingDTable_internal_fast_asm_loop;
    }
#endif

    if (!(flags & HUF_flags_disableFast)) {
        size_t const ret = HUF_decompress4X2_usingDTable_internal_fast(dst, dstSize, cSrc, cSrcSize, DTable, loopFn);
        if (ret != 0)
            return ret;
    }
    return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
}